

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixMatrix.h
# Opt level: O3

void __thiscall
Eigen::internal::
gemm_functor<double,_long,_Eigen::internal::general_matrix_matrix_product<long,_double,_0,_false,_double,_0,_false,_0>,_Eigen::Map<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::internal::gemm_blocking_space<0,_double,_double,_-1,_-1,_-1,_1,_false>_>
::operator()(gemm_functor<double,_long,_Eigen::internal::general_matrix_matrix_product<long,_double,_0,_false,_double,_0,_false,_0>,_Eigen::Map<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::gemm_blocking_space<0,_double,_double,__1,__1,__1,_1,_false>_>
             *this,long row,long rows,long col,long cols,GemmParallelInfo<long> *info)

{
  Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *pMVar1;
  Map<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *pMVar2;
  long rhsStride;
  long resStride;
  
  pMVar1 = this->m_rhs;
  if (cols == -1) {
    cols = (pMVar1->
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
           ).
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_cols.m_value;
  }
  pMVar2 = this->m_lhs;
  rhsStride = (pMVar1->m_stride).super_Stride<_1,_0>.m_outer.m_value;
  resStride = (this->m_dest->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
              m_storage.m_rows;
  general_matrix_matrix_product<long,_double,_0,_false,_double,_0,_false,_0>::run
            (rows,cols,
             (pMVar2->
             super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             ).m_cols.m_value,
             (pMVar2->
             super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             ).m_data + row,(pMVar2->m_stride).super_Stride<_1,_0>.m_outer.m_value,
             (pMVar1->
             super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
             ).
             super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_data + rhsStride * col,rhsStride,
             (this->m_dest->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
             m_storage.m_data + col * resStride + row,resStride,this->m_actualAlpha,
             &this->m_blocking->super_level3_blocking<double,_double>,info);
  return;
}

Assistant:

void operator() (Index row, Index rows, Index col=0, Index cols=-1, GemmParallelInfo<Index>* info=0) const
  {
    if(cols==-1)
      cols = m_rhs.cols();

    Gemm::run(rows, cols, m_lhs.cols(),
              /*(const Scalar*)*/&m_lhs.coeffRef(row,0), m_lhs.outerStride(),
              /*(const Scalar*)*/&m_rhs.coeffRef(0,col), m_rhs.outerStride(),
              (Scalar*)&(m_dest.coeffRef(row,col)), m_dest.outerStride(),
              m_actualAlpha, m_blocking, info);
  }